

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O1

void __thiscall
AmsRouter::AwaitConnectionAttempts
          (AmsRouter *this,AmsNetId *ams,unique_lock<std::recursive_mutex> *lock)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  
  iVar2 = std::
          _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_std::tuple<>_>,_std::_Select1st<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
          ::find(&(this->connection_attempts)._M_t,ams);
  p_Var1 = &(this->connection_attempts)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node != p_Var1) {
    do {
      std::_V2::condition_variable_any::wait<std::unique_lock<std::recursive_mutex>>
                (&this->connection_attempt_events,lock);
      iVar2 = std::
              _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_std::tuple<>_>,_std::_Select1st<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
              ::find(&(this->connection_attempts)._M_t,ams);
    } while ((_Rb_tree_header *)iVar2._M_node != p_Var1);
  }
  return;
}

Assistant:

void AmsRouter::AwaitConnectionAttempts(const AmsNetId& ams, std::unique_lock<std::recursive_mutex>& lock)
{
    connection_attempt_events.wait(lock, [&]() { return connection_attempts.find(ams) == connection_attempts.end(); });
}